

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

void mbedtls_gf128mul_x_ble(uchar *r,uchar *x)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  
  bVar3 = x[7];
  uVar14 = (ulong)x[6] << 0x30 | (ulong)bVar3 << 0x38;
  bVar4 = x[4];
  bVar5 = x[3];
  bVar6 = *x;
  uVar15 = (ulong)x[5] << 0x28 | uVar14;
  uVar12 = (uint)x[2] << 0x10 | (uint)((ulong)bVar5 * 0x1000000);
  bVar7 = x[0xf];
  uVar13 = (ulong)x[0xe] << 0x30 | (ulong)bVar7 << 0x38;
  bVar8 = x[0xb];
  iVar1 = (uint)x[1] * 0x200 + (bVar6 | uVar12) * 2;
  bVar9 = x[8];
  uVar16 = (uint)x[10] << 0x10 | (uint)((ulong)bVar8 * 0x1000000);
  iVar2 = (uint)x[9] * 0x200 + (bVar9 | uVar16) * 2;
  bVar10 = x[0xd];
  bVar11 = x[0xc];
  r[7] = (uchar)(uVar14 >> 0x37);
  uVar14 = (ulong)bVar4 << 0x20 | uVar15;
  r[6] = (uchar)(uVar15 >> 0x2f);
  r[5] = (uchar)(uVar14 >> 0x27);
  r[4] = (uchar)(uVar14 + (ulong)bVar5 * 0x1000000 >> 0x1f);
  r[3] = (uchar)(uVar12 >> 0x17);
  r[2] = (uchar)((uint)iVar1 >> 0x10);
  r[1] = (uchar)((uint)iVar1 >> 8);
  *r = (byte)(0x87L >> ((byte)~bVar7 >> 4 & 8)) ^ bVar6 * '\x02';
  uVar15 = (ulong)bVar10 << 0x28 | uVar13;
  r[0xf] = (uchar)(uVar13 >> 0x37);
  uVar14 = (ulong)bVar11 << 0x20 | uVar15;
  r[0xe] = (uchar)(uVar15 >> 0x2f);
  r[0xd] = (uchar)(uVar14 >> 0x27);
  r[0xc] = (uchar)(uVar14 + (ulong)bVar8 * 0x1000000 >> 0x1f);
  r[0xb] = (uchar)(uVar16 >> 0x17);
  r[10] = (uchar)((uint)iVar2 >> 0x10);
  r[9] = (uchar)((uint)iVar2 >> 8);
  r[8] = bVar9 * '\x02' - ((char)bVar3 >> 7);
  return;
}

Assistant:

static void mbedtls_gf128mul_x_ble( unsigned char r[16],
                                    const unsigned char x[16] )
{
    uint64_t a, b, ra, rb;

    GET_UINT64_LE( a, x, 0 );
    GET_UINT64_LE( b, x, 8 );

    ra = ( a << 1 )  ^ 0x0087 >> ( 8 - ( ( b >> 63 ) << 3 ) );
    rb = ( a >> 63 ) | ( b << 1 );

    PUT_UINT64_LE( ra, r, 0 );
    PUT_UINT64_LE( rb, r, 8 );
}